

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int DisconnectRazorAHRSx(RAZORAHRS *pRazorAHRS)

{
  int iVar1;
  int local_1c;
  int res;
  int id;
  RAZORAHRS *pRazorAHRS_local;
  
  local_1c = 0;
  do {
    if ((RAZORAHRS *)addrsRazorAHRS[local_1c] == pRazorAHRS) {
      iVar1 = DisconnectRazorAHRS(pRazorAHRS);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsRazorAHRS[local_1c] = (void *)0x0;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectRazorAHRSx(RAZORAHRS* pRazorAHRS)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectRazorAHRS(pRazorAHRS);
	if (res != EXIT_SUCCESS) return res;

	addrsRazorAHRS[id] = NULL;

	return EXIT_SUCCESS;
}